

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O1

void Cmd_playsound(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *pcVar2;
  FSoundID local_c;
  
  iVar1 = FCommandLine::argc(argv);
  if (1 < iVar1) {
    pcVar2 = FCommandLine::operator[](argv,1);
    local_c.ID = S_FindSound(pcVar2);
    if (local_c.ID == 0) {
      pcVar2 = FCommandLine::operator[](argv,1);
      Printf("\'%s\' is not a sound\n",pcVar2);
      return;
    }
    S_StartSound((AActor *)0x0,(sector_t *)0x0,(FPolyObj *)0x0,(FVector3 *)0x0,0x20,&local_c,1.0,0.0
                 ,(FRolloffInfo *)0x0);
  }
  return;
}

Assistant:

CCMD (playsound)
{
	if (argv.argc() > 1)
	{
		FSoundID id = argv[1];
		if (id == 0)
		{
			Printf("'%s' is not a sound\n", argv[1]);
		}
		else
		{
			S_Sound (CHAN_AUTO | CHAN_UI, id, 1.f, ATTN_NONE);
		}
	}
}